

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

int pem_des_decrypt(uchar *des_iv,uchar *buf,size_t buflen,uchar *pwd,size_t pwdlen)

{
  int local_bc;
  uchar local_b8 [4];
  int ret;
  uchar des_key [8];
  mbedtls_des_context des_ctx;
  size_t pwdlen_local;
  uchar *pwd_local;
  size_t buflen_local;
  uchar *buf_local;
  uchar *des_iv_local;
  
  mbedtls_des_init((mbedtls_des_context *)des_key);
  local_bc = pem_pbkdf1(local_b8,8,des_iv,pwd,pwdlen);
  if ((local_bc == 0) &&
     (local_bc = mbedtls_des_setkey_dec((mbedtls_des_context *)des_key,local_b8), local_bc == 0)) {
    local_bc = mbedtls_des_crypt_cbc((mbedtls_des_context *)des_key,0,buflen,des_iv,buf,buf);
  }
  mbedtls_des_free((mbedtls_des_context *)des_key);
  mbedtls_platform_zeroize(local_b8,8);
  return local_bc;
}

Assistant:

static int pem_des_decrypt( unsigned char des_iv[8],
                            unsigned char *buf, size_t buflen,
                            const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_des_context des_ctx;
    unsigned char des_key[8];
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    mbedtls_des_init( &des_ctx );

    if( ( ret = pem_pbkdf1( des_key, 8, des_iv, pwd, pwdlen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_des_setkey_dec( &des_ctx, des_key ) ) != 0 )
        goto exit;
    ret = mbedtls_des_crypt_cbc( &des_ctx, MBEDTLS_DES_DECRYPT, buflen,
                     des_iv, buf, buf );

exit:
    mbedtls_des_free( &des_ctx );
    mbedtls_platform_zeroize( des_key, 8 );

    return( ret );
}